

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getShortRangePotential(Snapshot *this)

{
  if (this->hasShortRangePotential == false) {
    (this->frameData).shortRangePotential =
         (this->frameData).bondPotential + (this->frameData).bendPotential +
         (this->frameData).torsionPotential + (this->frameData).inversionPotential;
    this->hasShortRangePotential = true;
    this->hasPotentialEnergy = false;
    this->hasTotalEnergy = false;
  }
  return (this->frameData).shortRangePotential;
}

Assistant:

RealType Snapshot::getShortRangePotential() {
    if (!hasShortRangePotential) {
      frameData.shortRangePotential = frameData.bondPotential;
      frameData.shortRangePotential += frameData.bendPotential;
      frameData.shortRangePotential += frameData.torsionPotential;
      frameData.shortRangePotential += frameData.inversionPotential;
      hasShortRangePotential = true;
      hasPotentialEnergy     = false;
      hasTotalEnergy         = false;
    }
    return frameData.shortRangePotential;
  }